

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

float __thiscall slang::SVInt::toFloat(SVInt *this)

{
  float fVar1;
  SVInt *in_stack_00000098;
  SVInt *in_stack_ffffffffffffffc8;
  SVInt *in_stack_ffffffffffffffe0;
  SVInt local_18;
  
  SVInt(&local_18,in_stack_ffffffffffffffc8);
  fVar1 = toIEEE754<float,8,23,127>(in_stack_00000098);
  ~SVInt(in_stack_ffffffffffffffe0);
  return fVar1;
}

Assistant:

float SVInt::toFloat() const {
    return toIEEE754<float, 8, 23, 127>(*this);
}